

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::RepeatLoopFixedGroupLastIterationInst::Exec
          (RepeatLoopFixedGroupLastIterationInst *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  BeginLoopFixedGroupLastIterationInst *pBVar3;
  LoopInfo *pLVar4;
  uint8 *puVar5;
  Cont *pCVar6;
  undefined4 *puVar7;
  GroupInfo *pGVar8;
  RewindLoopFixedGroupLastIterationCont *this_00;
  GroupInfo *groupInfo;
  RewindLoopFixedGroupLastIterationCont *rewind;
  Cont *top;
  LoopInfo *loopInfo;
  BeginLoopFixedGroupLastIterationInst *begin;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  RepeatLoopFixedGroupLastIterationInst *this_local;
  
  pBVar3 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopFixedGroupLastIterationInst>
                     (matcher,BeginLoopFixedGroupLastIteration,
                      (this->super_RepeatLoopMixin).beginLabel);
  pLVar4 = Matcher::LoopIdToLoopInfo
                     (matcher,(pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  pLVar4->number = pLVar4->number + 1;
  if (pLVar4->number < (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
    puVar5 = Matcher::LabelToInstPointer(matcher,(this->super_RepeatLoopMixin).beginLabel + 0x1c);
    *instPointer = puVar5;
  }
  else if (((pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper == 0xffffffff)
          || (pLVar4->number <
              (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper)) {
    if (pLVar4->number == (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
      this_00 = (RewindLoopFixedGroupLastIterationCont *)
                ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                Push<UnifiedRegex::RewindLoopFixedGroupLastIterationCont>
                          (&contStack->
                            super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      RewindLoopFixedGroupLastIterationCont::RewindLoopFixedGroupLastIterationCont
                (this_00,(this->super_RepeatLoopMixin).beginLabel,true);
      Matcher::PushStats(matcher,contStack,input);
    }
    puVar5 = Matcher::LabelToInstPointer(matcher,(this->super_RepeatLoopMixin).beginLabel + 0x1c);
    *instPointer = puVar5;
  }
  else {
    if ((pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower <
        (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper) {
      pCVar6 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                         (&contStack->
                           super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      if (pCVar6 == (Cont *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xe3b,"(top != 0)","top != 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (pCVar6->tag != RewindLoopFixedGroupLastIteration) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xe3c,"(top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration)",
                           "top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      *(undefined1 *)&pCVar6[1]._vptr_Cont = 0;
    }
    pGVar8 = Matcher::GroupIdToGroupInfo(matcher,(pBVar3->super_GroupMixin).groupId);
    pGVar8->offset = *inputOffset - (pBVar3->super_FixedLengthMixin).length;
    pGVar8->length = (pBVar3->super_FixedLengthMixin).length;
    puVar5 = Matcher::LabelToInstPointer(matcher,(pBVar3->super_BeginLoopMixin).exitLabel);
    *instPointer = puVar5;
  }
  return false;
}

Assistant:

inline bool RepeatLoopFixedGroupLastIterationInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopFixedGroupLastIterationInst* begin = matcher.L2I(BeginLoopFixedGroupLastIteration, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body. Failure of body signals failure of the entire loop.
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedGroupLastIterationInst));
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Matched maximum number of iterations. Continue with follow.
            if (begin->repeats.lower < begin->repeats.upper)
            {
                // Failure of follow will try one fewer iterations (subject to repeats.lower).
                // Since loop body is non-deterministic and does not define groups the rewind continuation must be on top of the stack.
                Cont *top = contStack.Top();
                Assert(top != 0);
                Assert(top->tag == Cont::ContTag::RewindLoopFixedGroupLastIteration);
                RewindLoopFixedGroupLastIterationCont* rewind = (RewindLoopFixedGroupLastIterationCont*)top;
                rewind->tryingBody = false;
            }
            // else: we never pushed a rewind continuation

            // Bind group
            GroupInfo* groupInfo = matcher.GroupIdToGroupInfo(begin->groupId);
            groupInfo->offset = inputOffset - begin->length;
            groupInfo->length = begin->length;

            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body. Failure of body will rewind input to here and
            // try follow.
            if (loopInfo->number == begin->repeats.lower)
            {
                // i.e. begin->repeats.lower > 0, so continuation won't have been pushed in BeginLoopFixed
                PUSH(contStack, RewindLoopFixedGroupLastIterationCont, beginLabel, true);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopFixedGroupLastIterationInst));
        }
        return false;
    }